

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O2

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  int iVar2;
  int p;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  int i;
  int iVar6;
  Mat local_70;
  
  iVar6 = bottom_blob->w;
  iVar4 = bottom_blob->h;
  iVar3 = iVar4 * iVar6 * bottom_blob->c;
  iVar2 = this->ndim;
  if (iVar2 == 3) {
    if (this->w != 0) {
      iVar6 = this->w;
    }
    if (this->h != 0) {
      iVar4 = this->h;
    }
    iVar2 = bottom_blob->c;
    if (this->c != 0) {
      iVar2 = this->c;
    }
    if (iVar6 == -1) {
      iVar6 = (int)((long)((ulong)(uint)((int)((long)iVar3 / (long)iVar2) >> 0x1f) << 0x20 |
                          (long)iVar3 / (long)iVar2 & 0xffffffffU) / (long)iVar4);
    }
    if (iVar4 == -1) {
      iVar4 = (int)((long)((ulong)(uint)((int)((long)iVar3 / (long)iVar2) >> 0x1f) << 0x20 |
                          (long)iVar3 / (long)iVar2 & 0xffffffffU) / (long)iVar6);
    }
    if (iVar2 == -1) {
      iVar2 = (int)((long)((ulong)(uint)((int)((long)iVar3 / (long)iVar4) >> 0x1f) << 0x20 |
                          (long)iVar3 / (long)iVar4 & 0xffffffffU) / (long)iVar6);
    }
    Mat::reshape(&local_70,bottom_blob,iVar6,iVar4,iVar2,opt->blob_allocator);
    Mat::operator=(top_blob,&local_70);
  }
  else if (iVar2 == 2) {
    if (this->w != 0) {
      iVar6 = this->w;
    }
    if (this->h != 0) {
      iVar4 = this->h;
    }
    if (iVar6 == -1) {
      iVar6 = iVar3 / iVar4;
    }
    if (iVar4 == -1) {
      iVar4 = iVar3 / iVar6;
    }
    Mat::reshape(&local_70,bottom_blob,iVar6,iVar4,opt->blob_allocator);
    Mat::operator=(top_blob,&local_70);
  }
  else {
    if (iVar2 != 1) goto LAB_0013a67d;
    if (this->w != 0) {
      iVar6 = this->w;
    }
    if (iVar6 == -1) {
      iVar6 = iVar3;
    }
    if (this->permute == 1) {
      Mat::create(top_blob,iVar6,bottom_blob->elemsize,opt->blob_allocator);
      puVar5 = (undefined4 *)top_blob->data;
      if (puVar5 == (undefined4 *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      for (iVar6 = 0; iVar6 < bottom_blob->h; iVar6 = iVar6 + 1) {
        iVar4 = bottom_blob->w;
        for (iVar2 = 0; iVar2 < iVar4; iVar2 = iVar2 + 1) {
          for (iVar3 = 0; iVar3 < bottom_blob->c; iVar3 = iVar3 + 1) {
            Mat::channel(&local_70,bottom_blob,iVar3);
            pvVar1 = local_70.data;
            Mat::~Mat(&local_70);
            iVar4 = bottom_blob->w;
            *puVar5 = *(undefined4 *)((long)pvVar1 + (long)(iVar4 * iVar6 + iVar2) * 4);
            puVar5 = puVar5 + 1;
          }
        }
      }
      goto LAB_0013a67d;
    }
    Mat::reshape(&local_70,bottom_blob,iVar6,opt->blob_allocator);
    Mat::operator=(top_blob,&local_70);
  }
  Mat::~Mat(&local_70);
LAB_0013a67d:
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    return 0;
  }
  return -100;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.c;

    if (ndim == 1)
    {
        int _w = w;

        if (_w == 0)
            _w = bottom_blob.w;

        if (_w == -1)
            _w = total;

        if (permute == 1)
        {
            top_blob.create(_w, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // c-h-w to h-w-c
            float* ptr = top_blob;
            for (int i=0; i<bottom_blob.h; i++)
            {
                for (int j=0; j<bottom_blob.w; j++)
                {
                    for (int p=0; p<bottom_blob.c; p++)
                    {
                        const float* bptr = bottom_blob.channel(p);
                        *ptr++ = bptr[i*bottom_blob.w + j];
                    }
                }
            }
        }
        else
        {
            top_blob = bottom_blob.reshape(_w, opt.blob_allocator);
        }
    }
    else if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = bottom_blob.w;
        if (_h == 0)
            _h = bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        top_blob = bottom_blob.reshape(_w, _h, opt.blob_allocator);
    }
    else if (ndim == 3)
    {
        int _w = w;
        int _h = h;
        int _c = c;

        if (_w == 0)
            _w = bottom_blob.w;
        if (_h == 0)
            _h = bottom_blob.h;
        if (_c == 0)
            _c = bottom_blob.c;

        if (_w == -1)
            _w = total / _c / _h;
        if (_h == -1)
            _h = total / _c / _w;
        if (_c == -1)
            _c = total / _h / _w;

        top_blob = bottom_blob.reshape(_w, _h, _c, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}